

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program.cpp
# Opt level: O1

LogicProgram * __thiscall
Clasp::Asp::LogicProgram::addMinimize(LogicProgram *this,weight_t prio,WeightLitSpan *lits)

{
  pointer ppMVar1;
  Atom_t AVar2;
  Min *pMVar3;
  size_t sVar4;
  WeightLit_t *pWVar5;
  Atom_t atomId;
  bool bVar6;
  weight_t *pwVar7;
  ulong uVar8;
  long lVar10;
  pointer pos;
  SingleOwnerPtr<Clasp::Asp::LogicProgram::Min,_Clasp::DeleteObject> n;
  DeleteObject deleter;
  undefined8 *local_40;
  Memcpy<Potassco::WeightLit_t> local_38;
  WeightLit_t local_30;
  ulong uVar9;
  
  if ((this->super_ProgramBuilder).frozen_ == true) {
    Potassco::fail(-2,
                   "LogicProgram &Clasp::Asp::LogicProgram::addMinimize(weight_t, const Potassco::WeightLitSpan &)"
                   ,0x349,"!frozen()","Can\'t update frozen program!",0);
  }
  local_40 = (undefined8 *)operator_new(0x18);
  bVar6 = true;
  *local_40 = 0;
  local_40[1] = 0;
  local_40[2] = 0;
  pwVar7 = (weight_t *)((ulong)local_40 & 0xfffffffffffffffe);
  *pwVar7 = prio;
  pos = (this->minimize_).ebo_.buf;
  uVar9 = (ulong)(this->minimize_).ebo_.size;
  ppMVar1 = pos + uVar9;
  if (uVar9 != 0) {
    do {
      uVar8 = uVar9 >> 1;
      if (pos[uVar8]->prio < prio) {
        pos = pos + uVar8 + 1;
        uVar8 = ~uVar8 + uVar9;
      }
      uVar9 = uVar8;
    } while (0 < (long)uVar8);
  }
  if ((pos == ppMVar1) || (pMVar3 = *pos, pMVar3->prio != prio)) {
    local_38.first_ = lits->first;
    sVar4 = lits->size;
    pwVar7[4] = 0;
    bk_lib::pod_vector<Potassco::WeightLit_t,std::allocator<Potassco::WeightLit_t>>::
    insert_impl<unsigned_int,bk_lib::detail::Memcpy<Potassco::WeightLit_t>>
              ((pod_vector<Potassco::WeightLit_t,std::allocator<Potassco::WeightLit_t>> *)
               (pwVar7 + 2),*(iterator *)(pwVar7 + 2),(uint)sVar4,&local_38);
    local_30 = (WeightLit_t)((ulong)local_40 & 0xfffffffffffffffe);
    local_38.first_ = &local_30;
    bk_lib::
    pod_vector<Clasp::Asp::LogicProgram::Min*,std::allocator<Clasp::Asp::LogicProgram::Min*>>::
    insert_impl<unsigned_int,bk_lib::detail::Fill<Clasp::Asp::LogicProgram::Min*>>
              ((pod_vector<Clasp::Asp::LogicProgram::Min*,std::allocator<Clasp::Asp::LogicProgram::Min*>>
                *)&this->minimize_,pos,1,(Fill<Clasp::Asp::LogicProgram::Min_*> *)&local_38);
    local_40 = (undefined8 *)((ulong)local_40 & 0xfffffffffffffffe);
    bVar6 = false;
    *(int *)(&this->field_0x24 + (long)this->statsId_ * 0x14) =
         *(int *)(&this->field_0x24 + (long)this->statsId_ * 0x14) + 1;
  }
  else {
    local_38.first_ = lits->first;
    bk_lib::pod_vector<Potassco::WeightLit_t,std::allocator<Potassco::WeightLit_t>>::
    insert_impl<unsigned_int,bk_lib::detail::Memcpy<Potassco::WeightLit_t>>
              ((pod_vector<Potassco::WeightLit_t,std::allocator<Potassco::WeightLit_t>> *)
               &pMVar3->lits,(pMVar3->lits).ebo_.buf + (pMVar3->lits).ebo_.size,(uint)lits->size,
               &local_38);
  }
  sVar4 = lits->size;
  if (sVar4 != 0) {
    pWVar5 = lits->first;
    lVar10 = 0;
    do {
      AVar2 = *(Atom_t *)((long)&pWVar5->lit + lVar10);
      atomId = -AVar2;
      if (0 < (int)AVar2) {
        atomId = AVar2;
      }
      resize(this,atomId);
      lVar10 = lVar10 + 8;
    } while (sVar4 << 3 != lVar10);
  }
  if (bVar6 && (Min *)((ulong)local_40 & 0xfffffffffffffffe) != (Min *)0x0) {
    DeleteObject::operator()
              ((DeleteObject *)&local_38,(Min *)((ulong)local_40 & 0xfffffffffffffffe));
  }
  return this;
}

Assistant:

LogicProgram& LogicProgram::addMinimize(weight_t prio, const Potassco::WeightLitSpan& lits) {
	check_not_frozen();
	SingleOwnerPtr<Min> n(new Min());
	n->prio = prio;
	MinList::iterator it = std::lower_bound(minimize_.begin(), minimize_.end(), n.get(), CmpMin());
	if (it == minimize_.end() || (*it)->prio != prio) {
		n->lits.assign(Potassco::begin(lits), Potassco::end(lits));
		minimize_.insert(it, n.get());
		n.release();
		upStat(RuleStats::Minimize);
	}
	else {
		(*it)->lits.insert((*it)->lits.end(), Potassco::begin(lits), Potassco::end(lits));
	}
	// Touch all atoms in minimize -> these are input atoms even if they won't occur in a head.
	for (Potassco::WeightLitSpan::iterator wIt = Potassco::begin(lits), end = Potassco::end(lits); wIt != end; ++wIt) {
		resize(Potassco::atom(*wIt));
	}
	return *this;
}